

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

SubscriptPair __thiscall
spvtools::opt::LoopDependenceAnalysis::PropagateConstraints
          (LoopDependenceAnalysis *this,SubscriptPair *subscript_pair,
          vector<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_>
          *constraints)

{
  ScalarEvolutionAnalysis *this_00;
  pointer ppCVar1;
  int iVar2;
  SENode *pSVar3;
  SENode *operand_1;
  undefined4 extraout_var;
  SENode *operand_2;
  SENode *pSVar4;
  SERecurrentNode *old_child;
  SENode *pSVar5;
  Constraint **constraint;
  pointer ppCVar6;
  SubscriptPair SVar7;
  
  pSVar4 = subscript_pair->first;
  pSVar5 = subscript_pair->second;
  ppCVar6 = (constraints->
            super__Vector_base<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (constraints->
            super__Vector_base<spvtools::opt::Constraint_*,_std::allocator<spvtools::opt::Constraint_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar6 != ppCVar1) {
    this_00 = &this->scalar_evolution_;
    do {
      pSVar3 = ScalarEvolutionAnalysis::GetCoefficientFromRecurrentTerm
                         (this_00,pSVar4,(*ppCVar6)->loop_);
      operand_1 = ScalarEvolutionAnalysis::GetCoefficientFromRecurrentTerm
                            (this_00,pSVar5,(*ppCVar6)->loop_);
      iVar2 = (**(*ppCVar6)->_vptr_Constraint)();
      if (iVar2 == 1) {
        iVar2 = (*(*ppCVar6)->_vptr_Constraint[5])();
        operand_2 = ScalarEvolutionAnalysis::CreateMultiplyNode
                              (this_00,pSVar3,*(SENode **)(CONCAT44(extraout_var,iVar2) + 0x10));
        pSVar4 = ScalarEvolutionAnalysis::BuildGraphWithoutRecurrentTerm
                           (this_00,pSVar4,(*ppCVar6)->loop_);
        pSVar4 = ScalarEvolutionAnalysis::CreateSubtraction(this_00,pSVar4,operand_2);
        pSVar4 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar4);
        pSVar3 = ScalarEvolutionAnalysis::CreateSubtraction(this_00,operand_1,pSVar3);
        pSVar3 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar3);
        old_child = ScalarEvolutionAnalysis::GetRecurrentTerm(this_00,pSVar5,(*ppCVar6)->loop_);
        if (old_child != (SERecurrentNode *)0x0) {
          pSVar3 = ScalarEvolutionAnalysis::CreateRecurrentExpression
                             (this_00,(*ppCVar6)->loop_,old_child->offset_,pSVar3);
          pSVar5 = ScalarEvolutionAnalysis::UpdateChildNode
                             (this_00,pSVar5,&old_child->super_SENode,pSVar3);
        }
      }
      ppCVar6 = ppCVar6 + 1;
    } while (ppCVar6 != ppCVar1);
  }
  pSVar5 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar5);
  SVar7.second = pSVar5;
  SVar7.first = pSVar4;
  return SVar7;
}

Assistant:

SubscriptPair LoopDependenceAnalysis::PropagateConstraints(
    const SubscriptPair& subscript_pair,
    const std::vector<Constraint*>& constraints) {
  SENode* new_first = subscript_pair.first;
  SENode* new_second = subscript_pair.second;

  for (auto& constraint : constraints) {
    // In the paper this is a[k]. We're extracting the coefficient ('a') of a
    // recurrent expression with respect to the loop 'k'.
    SENode* coefficient_of_recurrent =
        scalar_evolution_.GetCoefficientFromRecurrentTerm(
            new_first, constraint->GetLoop());

    // In the paper this is a'[k].
    SENode* coefficient_of_recurrent_prime =
        scalar_evolution_.GetCoefficientFromRecurrentTerm(
            new_second, constraint->GetLoop());

    if (constraint->GetType() == Constraint::Distance) {
      DependenceDistance* as_distance = constraint->AsDependenceDistance();

      // In the paper this is a[k]*d
      SENode* rhs = scalar_evolution_.CreateMultiplyNode(
          coefficient_of_recurrent, as_distance->GetDistance());

      // In the paper this is a[k] <- 0
      SENode* zeroed_coefficient =
          scalar_evolution_.BuildGraphWithoutRecurrentTerm(
              new_first, constraint->GetLoop());

      // In the paper this is e <- e - a[k]*d.
      new_first = scalar_evolution_.CreateSubtraction(zeroed_coefficient, rhs);
      new_first = scalar_evolution_.SimplifyExpression(new_first);

      // In the paper this is a'[k] - a[k].
      SENode* new_child = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.CreateSubtraction(coefficient_of_recurrent_prime,
                                              coefficient_of_recurrent));

      // In the paper this is a'[k]'i[k].
      SERecurrentNode* prime_recurrent =
          scalar_evolution_.GetRecurrentTerm(new_second, constraint->GetLoop());

      if (!prime_recurrent) continue;

      // As we hash the nodes we need to create a new node when we update a
      // child.
      SENode* new_recurrent = scalar_evolution_.CreateRecurrentExpression(
          constraint->GetLoop(), prime_recurrent->GetOffset(), new_child);
      // In the paper this is a'[k] <- a'[k] - a[k].
      new_second = scalar_evolution_.UpdateChildNode(
          new_second, prime_recurrent, new_recurrent);
    }
  }

  new_second = scalar_evolution_.SimplifyExpression(new_second);
  return std::make_pair(new_first, new_second);
}